

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O3

int nn_sinproc_send(nn_pipebase *self,nn_msg *msg)

{
  nn_chunkref *self_00;
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  nn_fsm *self_01;
  long lVar8;
  ulong uVar9;
  nn_msgqueue *unaff_R14;
  nn_msg nmsg;
  nn_msg local_90;
  
  self_01 = (nn_fsm *)&self[-1].data;
  if (self == (nn_pipebase *)0x0) {
    self_01 = (nn_fsm *)0x0;
  }
  uVar2 = *(uint *)&self_01[1].fn;
  uVar9 = (ulong)uVar2;
  if (uVar2 == 5) {
    return -0x68;
  }
  if (uVar2 == 4) {
    if (((ulong)self_01[1].fn & 0x100000000) == 0) {
      sVar4 = nn_chunkref_size(&msg->sphdr);
      self_00 = &msg->body;
      sVar5 = nn_chunkref_size(self_00);
      nn_msg_init(&local_90,sVar4 + sVar5);
      pvVar6 = nn_chunkref_data(&local_90.body);
      pvVar7 = nn_chunkref_data(&msg->sphdr);
      sVar4 = nn_chunkref_size(&msg->sphdr);
      memcpy(pvVar6,pvVar7,sVar4);
      pvVar6 = nn_chunkref_data(&local_90.body);
      sVar4 = nn_chunkref_size(&msg->sphdr);
      pvVar7 = nn_chunkref_data(self_00);
      sVar5 = nn_chunkref_size(self_00);
      memcpy((void *)((long)pvVar6 + sVar4),pvVar7,sVar5);
      nn_msg_term(msg);
      nn_msg_term((nn_msg *)&self_01[4].owner);
      nn_msg_mv((nn_msg *)&self_01[4].owner,&local_90);
      pbVar1 = (byte *)((long)&self_01[1].fn + 4);
      *pbVar1 = *pbVar1 | 1;
      nn_fsm_raiseto(self_01,(nn_fsm *)self_01[1].shutdown_fn,
                     (nn_fsm_event *)&((nn_fsm *)self_01[1].shutdown_fn)[5].stopped.item,0x6c41,4,
                     self_01);
      return 0;
    }
  }
  else {
    nn_sinproc_send_cold_2();
  }
  nn_sinproc_send_cold_1();
  lVar8 = uVar9 - 0x68;
  if (uVar9 == 0) {
    lVar8 = 0;
  }
  if (*(int *)(lVar8 + 0x58) - 6U < 0xfffffffe) {
    nn_sinproc_recv_cold_3();
LAB_0012964b:
    nn_sinproc_recv_cold_1();
  }
  else {
    unaff_R14 = (nn_msgqueue *)(lVar8 + 0x140);
    iVar3 = nn_msgqueue_recv(unaff_R14,msg);
    if (iVar3 != 0) goto LAB_0012964b;
    if ((*(int *)(lVar8 + 0x58) == 5) || ((*(byte *)(lVar8 + 0x5c) & 2) == 0)) goto LAB_00129624;
  }
  nn_sinproc_recv_cold_2();
LAB_00129624:
  iVar3 = nn_msgqueue_empty(unaff_R14);
  if (iVar3 == 0) {
    nn_pipebase_received((nn_pipebase *)(lVar8 + 0x68));
  }
  return 0;
}

Assistant:

static int nn_sinproc_send (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sinproc *sinproc;
    struct nn_msg nmsg;

    sinproc = nn_cont (self, struct nn_sinproc, pipebase);

    /*  If the peer have already closed the connection, we cannot send
        anymore. */
    if (sinproc->state == NN_SINPROC_STATE_DISCONNECTED)
        return -ECONNRESET;

    /*  Sanity checks. */
    nn_assert_state (sinproc, NN_SINPROC_STATE_ACTIVE);
    nn_assert (!(sinproc->flags & NN_SINPROC_FLAG_SENDING));

    nn_msg_init (&nmsg,
        nn_chunkref_size (&msg->sphdr) +
        nn_chunkref_size (&msg->body));
    memcpy (nn_chunkref_data (&nmsg.body),
        nn_chunkref_data (&msg->sphdr),
        nn_chunkref_size (&msg->sphdr));
    memcpy ((char *)nn_chunkref_data (&nmsg.body) +
        nn_chunkref_size (&msg->sphdr),
        nn_chunkref_data (&msg->body),
        nn_chunkref_size (&msg->body));
    nn_msg_term (msg);

    /*  Expose the message to the peer. */
    nn_msg_term (&sinproc->msg);
    nn_msg_mv (&sinproc->msg, &nmsg);

    /*  Notify the peer that there's a message to get. */
    sinproc->flags |= NN_SINPROC_FLAG_SENDING;
    nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
        &sinproc->peer->event_sent, NN_SINPROC_SRC_PEER,
        NN_SINPROC_SENT, sinproc);

    return 0;
}